

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O2

bool rom2snsf(char *rom_path,char *snsf_path,uint32_t load_offset,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *tags)

{
  bool bVar1;
  int iVar2;
  undefined1 *__ptr;
  FILE *__stream;
  size_t sVar3;
  FILE *__n;
  char *pcVar4;
  allocator local_129;
  char *local_128;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_120;
  string local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  ZlibWriter zlib_exe;
  
  local_128 = rom_path;
  iVar2 = stat(rom_path,(stat *)&zlib_exe);
  if ((iVar2 == 0) && (zlib_exe.z.total_in != 0xffffffffffffffff)) {
    if (zlib_exe.z.total_in < 0x800001) {
      local_120 = &tags->_M_t;
      __ptr = (undefined1 *)malloc((size_t)(zlib_exe.z.total_in + 8));
      pcVar4 = local_128;
      if (__ptr == (undefined1 *)0x0) {
        fwrite("Error: Memory allocation error\n",0x1f,1,_stderr);
        return false;
      }
      *__ptr = (char)load_offset;
      __ptr[1] = (char)(load_offset >> 8);
      __ptr[2] = (char)(load_offset >> 0x10);
      __ptr[3] = (char)(load_offset >> 0x18);
      __ptr[4] = (char)zlib_exe.z.total_in;
      __ptr[5] = (char)(zlib_exe.z.total_in >> 8);
      __ptr[6] = (char)(zlib_exe.z.total_in >> 0x10);
      __ptr[7] = 0;
      __stream = fopen(local_128,"rb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Error: File open error \"%s\"\n",pcVar4);
      }
      else {
        __n = __stream;
        sVar3 = fread(__ptr + 8,1,zlib_exe.z.total_in,__stream);
        if (sVar3 == zlib_exe.z.total_in) {
          fclose(__stream);
          ZlibWriter::ZlibWriter(&zlib_exe,9);
          ZlibWriter::write(&zlib_exe,(int)__ptr,(void *)(zlib_exe.z.total_in + 8),(size_t)__n);
          std::__cxx11::string::string((string *)&local_118,snsf_path,&local_129);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&local_f8,local_120);
          bVar1 = PSFFile::save(&local_118,'#',(uint8_t *)0x0,0,&zlib_exe,
                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_f8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          if (!bVar1) {
            fprintf(_stderr,"Error: File write error \"%s\"\n",snsf_path);
          }
          free(__ptr);
          ZlibWriter::~ZlibWriter(&zlib_exe);
          return bVar1;
        }
        fprintf(_stderr,"Error: File read error \"%s\"\n",pcVar4);
        fclose(__stream);
      }
      free(__ptr);
      return false;
    }
    pcVar4 = "Error: File too large \"%s\"\n";
  }
  else {
    pcVar4 = "Error: File not found \"%s\"\n";
  }
  fprintf(_stderr,pcVar4,local_128);
  return false;
}

Assistant:

bool rom2snsf(const char * rom_path, const char * snsf_path, uint32_t load_offset, const std::map<std::string, std::string> & tags)
{
	off_t off_rom_size = path_getfilesize(rom_path);
	if (off_rom_size == -1) {
		fprintf(stderr, "Error: File not found \"%s\"\n", rom_path);
		return false;
	}

	size_t rom_size = off_rom_size;
	if (rom_size > SNES_ROM_MAX_SIZE) {
		fprintf(stderr, "Error: File too large \"%s\"\n", rom_path);
		return false;
	}

	uint8_t * exe = (uint8_t *)malloc(SNSF_EXE_HEADER_SIZE + rom_size);
	if (exe == NULL) {
		fprintf(stderr, "Error: Memory allocation error\n");
		return false;
	}
	writeInt(&exe[0], load_offset);
	writeInt(&exe[4], (uint32_t)rom_size);

	FILE * rom_file = fopen(rom_path, "rb");
	if (rom_file == NULL) {
		fprintf(stderr, "Error: File open error \"%s\"\n", rom_path);
		free(exe);
		return false;
	}

	if (fread(&exe[8], 1, rom_size, rom_file) != rom_size) {
		fprintf(stderr, "Error: File read error \"%s\"\n", rom_path);
		fclose(rom_file);
		free(exe);
		return false;
	}

	fclose(rom_file);

	ZlibWriter zlib_exe(Z_BEST_COMPRESSION);
	zlib_exe.write(exe, SNSF_EXE_HEADER_SIZE + rom_size);

	if (!PSFFile::save(snsf_path, SNSF_PSF_VERSION, NULL, 0, zlib_exe, tags)) {
		fprintf(stderr, "Error: File write error \"%s\"\n", snsf_path);
		free(exe);
		return false;
	}

	free(exe);

	return true;
}